

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

bool __thiscall osc::ReceivedMessageArgument::AsBoolUnchecked(ReceivedMessageArgument *this)

{
  MissingArgumentException *this_00;
  ReceivedMessageArgument *this_local;
  
  if (this->typeTagPtr_ == (char *)0x0) {
    this_00 = (MissingArgumentException *)__cxa_allocate_exception(0x10);
    MissingArgumentException::MissingArgumentException(this_00,"missing argument");
    __cxa_throw(this_00,&MissingArgumentException::typeinfo,
                MissingArgumentException::~MissingArgumentException);
  }
  return *this->typeTagPtr_ == 'T';
}

Assistant:

bool ReceivedMessageArgument::AsBoolUnchecked() const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == TRUE_TYPE_TAG )
		return true;
    else
	    return false;
}